

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O2

filepos_t GetBlockFrameSize(matroska_block *Element,size_t Frame,ebml_element *Header,
                           MatroskaTrackEncodingCompAlgo CompAlgo,
                           MatroskaContentEncodingScope CompScope)

{
  int iVar1;
  ebml_context *peVar2;
  size_t FrameNum;
  ebml_context *peVar3;
  filepos_t fVar4;
  size_t sVar5;
  err_t eVar6;
  long lVar7;
  size_t OutSize;
  
  if ((Element->SizeList)._Used >> 2 <= Frame) {
    return 0;
  }
  if ((Header != (ebml_element *)0x0 & (byte)CompScope) != 0) {
    peVar2 = Header->Context;
    peVar3 = MATROSKA_getContextContentCompAlgo();
    if (peVar2 != peVar3) {
      iVar1 = *(int *)((Element->SizeList)._Begin + Frame * 4);
      fVar4 = EBML_ElementDataSize(Header,1);
      return iVar1 - fVar4;
    }
    if ((Element->Base).Base.bValueIsSet == '\0') {
      __assert_fail("Element->Base.Base.bValueIsSet",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x633,
                    "filepos_t GetBlockFrameSize(const matroska_block *, size_t, const ebml_element *, MatroskaTrackEncodingCompAlgo, MatroskaContentEncodingScope)"
                   );
    }
    lVar7 = 0;
    for (sVar5 = 0; Frame != sVar5; sVar5 = sVar5 + 1) {
      lVar7 = lVar7 + *(int *)((Element->SizeList)._Begin + sVar5 * 4);
    }
    OutSize = (size_t)*(int *)((Element->SizeList)._Begin + Frame * 4);
    if ((Element->Data)._Used < lVar7 + OutSize) {
      __assert_fail("(PrevFramesSize + OutSize) <= ARRAYCOUNT(Element->Data,uint8_t)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x63e,
                    "filepos_t GetBlockFrameSize(const matroska_block *, size_t, const ebml_element *, MatroskaTrackEncodingCompAlgo, MatroskaContentEncodingScope)"
                   );
    }
    if (CompAlgo != MATROSKA_TRACK_ENCODING_COMP_ZLIB) {
      return OutSize;
    }
    eVar6 = CompressFrameZLib((uint8_t *)((Element->Data)._Begin + lVar7),OutSize,(uint8_t **)0x0,
                              &OutSize);
    if (eVar6 == 0) {
      return OutSize;
    }
  }
  return (long)*(int *)((Element->SizeList)._Begin + Frame * 4);
}

Assistant:

static filepos_t GetBlockFrameSize(const matroska_block *Element, size_t Frame, const ebml_element *Header,
                                   MatroskaTrackEncodingCompAlgo CompAlgo, MatroskaContentEncodingScope CompScope)
{
    if (Frame >= ARRAYCOUNT(Element->SizeList,int32_t))
        return 0;

    if (!Header || (CompScope & MATROSKA_CONTENTENCODINGSCOPE_BLOCK)==0)
        return ARRAYBEGIN(Element->SizeList,int32_t)[Frame];
    if (Header->Context==MATROSKA_getContextContentCompAlgo())
    {
        assert(Element->Base.Base.bValueIsSet);
        if (!Element->Base.Base.bValueIsSet)
            return ARRAYBEGIN(Element->SizeList,int32_t)[Frame]; // we can't tell the final size without decoding the data

        // skip previous frames data
        size_t PrevFramesSize = 0;
        for (size_t FrameNum=0; FrameNum<Frame; FrameNum++)
            PrevFramesSize += ARRAYBEGIN(Element->SizeList,int32_t)[FrameNum];

        // handle zlib
        size_t OutSize = ARRAYBEGIN(Element->SizeList,int32_t)[Frame];
        assert((PrevFramesSize + OutSize) <= ARRAYCOUNT(Element->Data,uint8_t));
        const uint8_t *Data = ARRAYBEGIN(Element->Data,uint8_t) + PrevFramesSize;
#if defined(CONFIG_EBML_WRITING)
#if defined(CONFIG_ZLIB)
        if (CompAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB && CompressFrameZLib(Data,ARRAYBEGIN(Element->SizeList,int32_t)[Frame],NULL,&OutSize)!=ERR_NONE)
            return ARRAYBEGIN(Element->SizeList,int32_t)[Frame]; // we can't tell the final size without decoding the data
#endif
#endif
        return OutSize;
    }
    return ARRAYBEGIN(Element->SizeList,int32_t)[Frame] - EBML_ElementDataSize(Header, 1); // header stripping
}